

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once.cc
# Opt level: O0

void google::protobuf::GoogleOnceInitImpl(ProtobufOnceType *once,Closure *closure)

{
  Atomic64 AVar1;
  long local_20;
  AtomicWord state;
  Closure *closure_local;
  ProtobufOnceType *once_local;
  
  AVar1 = internal::Acquire_Load(once);
  if (AVar1 != 2) {
    local_20 = internal::Acquire_CompareAndSwap(once,0,1);
    if (local_20 == 0) {
      (*closure->_vptr_Closure[2])();
      internal::Release_Store(once,2);
    }
    else {
      while (local_20 == 1) {
        anon_unknown_3::SchedYield();
        local_20 = internal::Acquire_Load(once);
      }
    }
  }
  return;
}

Assistant:

void GoogleOnceInitImpl(ProtobufOnceType* once, Closure* closure) {
  internal::AtomicWord state = internal::Acquire_Load(once);
  // Fast path. The provided closure was already executed.
  if (state == ONCE_STATE_DONE) {
    return;
  }
  // The closure execution did not complete yet. The once object can be in one
  // of the two following states:
  //   - UNINITIALIZED: We are the first thread calling this function.
  //   - EXECUTING_CLOSURE: Another thread is already executing the closure.
  //
  // First, try to change the state from UNINITIALIZED to EXECUTING_CLOSURE
  // atomically.
  state = internal::Acquire_CompareAndSwap(
      once, ONCE_STATE_UNINITIALIZED, ONCE_STATE_EXECUTING_CLOSURE);
  if (state == ONCE_STATE_UNINITIALIZED) {
    // We are the first thread to call this function, so we have to call the
    // closure.
    closure->Run();
    internal::Release_Store(once, ONCE_STATE_DONE);
  } else {
    // Another thread has already started executing the closure. We need to
    // wait until it completes the initialization.
    while (state == ONCE_STATE_EXECUTING_CLOSURE) {
      // Note that futex() could be used here on Linux as an improvement.
      SchedYield();
      state = internal::Acquire_Load(once);
    }
  }
}